

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::SimplePFor
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t ps)

{
  uint32_t uVar1;
  allocator_type local_12;
  allocator_type local_11;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2c50;
  (this->ecoder).super_IntegerCODEC._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2cc0;
  this->PageSize = ps;
  uVar1 = 0x20 - LZCOUNT(ps);
  if (ps == 0) {
    uVar1 = 0;
  }
  this->bitsPageSize = uVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->datatobepacked,(ulong)ps,&local_11);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->bytescontainer,(ulong)((this->PageSize * 3 >> 7) + this->PageSize),&local_12);
  return;
}

Assistant:

SimplePFor(uint32_t ps = 65536)
      : ecoder(), PageSize(ps), bitsPageSize(gccbits(PageSize)),
        datatobepacked(PageSize),
        bytescontainer(PageSize + 3 * PageSize / BlockSize) {
    assert(ps / BlockSize * BlockSize == ps);
    assert(gccbits(static_cast<uint32_t>(BlockSizeInUnitsOfPackSize * PACKSIZE - 1)) <= 8);
  }